

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLDeclaration * __thiscall tinyxml2::XMLDocument::NewDeclaration(XMLDocument *this,char *str)

{
  XMLNode *this_00;
  char *local_40;
  XMLDeclaration *dec;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
  XMLDeclaration::XMLDeclaration((XMLDeclaration *)this_00,this);
  this_00->_memPool = &(this->_commentPool).super_MemPool;
  local_40 = str;
  if (str == (char *)0x0) {
    local_40 = "xml version=\"1.0\" encoding=\"UTF-8\"";
  }
  XMLNode::SetValue(this_00,local_40,false);
  return (XMLDeclaration *)this_00;
}

Assistant:

XMLDeclaration* XMLDocument::NewDeclaration( const char* str )
{
    TIXMLASSERT( sizeof( XMLDeclaration ) == _commentPool.ItemSize() );
    XMLDeclaration* dec = new (_commentPool.Alloc()) XMLDeclaration( this );
    dec->_memPool = &_commentPool;
    dec->SetValue( str ? str : "xml version=\"1.0\" encoding=\"UTF-8\"" );
    return dec;
}